

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCommand.h
# Opt level: O2

void __thiscall cmSetPropertyCommand::cmSetPropertyCommand(cmSetPropertyCommand *this)

{
  _Rb_tree_header *p_Var1;
  
  (this->super_cmCommand).Makefile = (cmMakefile *)0x0;
  (this->super_cmCommand).Error._M_dataplus._M_p = (pointer)&(this->super_cmCommand).Error.field_2;
  (this->super_cmCommand).Error._M_string_length = 0;
  (this->super_cmCommand).Error.field_2._M_local_buf[0] = '\0';
  (this->super_cmCommand)._vptr_cmCommand = (_func_int **)&PTR__cmSetPropertyCommand_0064f438;
  (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(this->Names)._M_t._M_impl.super__Rb_tree_header;
  (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->Names)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->Names)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->PropertyName)._M_dataplus._M_p = (pointer)&(this->PropertyName).field_2;
  (this->PropertyName)._M_string_length = 0;
  (this->PropertyName).field_2._M_local_buf[0] = '\0';
  (this->PropertyValue)._M_dataplus._M_p = (pointer)&(this->PropertyValue).field_2;
  (this->PropertyValue)._M_string_length = 0;
  (this->PropertyValue).field_2._M_local_buf[0] = '\0';
  this->AppendAsString = false;
  this->Remove = true;
  this->AppendMode = false;
  return;
}

Assistant:

cmCommand()
    : Makefile(CM_NULLPTR)
  {
  }